

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_coding_update_channel_info
          (exr_coding_channel_info_t *channels,int16_t num_chans,exr_chunk_info_t *cinfo,
          exr_const_context_t ctxt,exr_const_priv_part_t part)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  exr_attr_chlist_t *peVar4;
  exr_attr_chlist_entry_t *peVar5;
  int iVar6;
  int iVar7;
  exr_result_t eVar8;
  ulong uVar9;
  undefined6 in_register_00000032;
  ulong uVar10;
  uint16_t *puVar11;
  
  peVar4 = (part->channels->field_6).chlist;
  uVar1 = peVar4->num_channels;
  if (uVar1 == (uint)CONCAT62(in_register_00000032,num_chans)) {
    uVar10 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar10;
    }
    puVar11 = &channels->data_type;
    for (; uVar9 * 0x20 != uVar10; uVar10 = uVar10 + 0x20) {
      peVar5 = peVar4->entries;
      ((exr_coding_channel_info_t *)(puVar11 + -0xd))->channel_name =
           *(char **)(peVar5->reserved + (uVar10 - 0xd));
      iVar2 = *(int *)(peVar5->reserved + uVar10 + 7);
      iVar6 = compute_sampled_height(cinfo->height,iVar2,cinfo->start_y);
      *(int *)(puVar11 + -9) = iVar6;
      iVar6 = cinfo->width;
      iVar3 = *(int *)(peVar5->reserved + uVar10 + 3);
      iVar7 = iVar6;
      if ((1 < iVar3) && (iVar7 = 1, iVar6 != 1)) {
        iVar7 = iVar6 / iVar3;
      }
      *(int *)(puVar11 + -7) = iVar7;
      *(int *)(puVar11 + -5) = iVar3;
      *(int *)(puVar11 + -3) = iVar2;
      *(uint8_t *)(puVar11 + -1) = peVar5->reserved[uVar10 - 1];
      iVar2 = *(int *)(peVar5->reserved + (uVar10 - 5));
      *(char *)((long)puVar11 + -1) = (iVar2 != 1) * '\x02' + '\x02';
      *puVar11 = (uint16_t)iVar2;
      puVar11 = puVar11 + 0x18;
    }
    return 0;
  }
  eVar8 = (*ctxt->print_error)
                    (ctxt,3,"Mismatch in channel counts: stored %d, incoming %d",
                     CONCAT62(in_register_00000032,num_chans) & 0xffffffff,(ulong)uVar1,
                     ctxt->print_error);
  return eVar8;
}

Assistant:

exr_result_t
internal_coding_update_channel_info (
    exr_coding_channel_info_t* channels,
    int16_t                    num_chans,
    const exr_chunk_info_t*    cinfo,
    exr_const_context_t        ctxt,
    exr_const_priv_part_t      part)
{
    int                chans;
    exr_attr_chlist_t* chanlist;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;

    if (num_chans != chans)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Mismatch in channel counts: stored %d, incoming %d",
            num_chans,
            chans);

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     ccic = (channels + c);

        ccic->channel_name = curc->name.str;

        ccic->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        ccic->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        ccic->x_samples = curc->x_sampling;
        ccic->y_samples = curc->y_sampling;

        ccic->p_linear          = curc->p_linear;
        ccic->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        ccic->data_type         = (uint16_t) (curc->pixel_type);
    }

    return EXR_ERR_SUCCESS;
}